

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O0

void __thiscall
libtorrent::session_params::session_params
          (session_params *this,settings_pack *sp,
          vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
          *exts)

{
  vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
  *exts_local;
  settings_pack *sp_local;
  session_params *this_local;
  
  settings_pack::settings_pack(&this->settings,sp);
  std::
  vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
  ::vector(&this->extensions,exts);
  libtorrent::dht::dht_settings::dht_settings(&this->dht_settings);
  libtorrent::dht::dht_state::dht_state(&this->dht_state);
  std::
  function<std::unique_ptr<libtorrent::dht::dht_storage_interface,std::default_delete<libtorrent::dht::dht_storage_interface>>(libtorrent::dht::dht_settings_const&)>
  ::
  function<std::unique_ptr<libtorrent::dht::dht_storage_interface,std::default_delete<libtorrent::dht::dht_storage_interface>>(&)(libtorrent::dht::dht_settings_const&),void>
            ((function<std::unique_ptr<libtorrent::dht::dht_storage_interface,std::default_delete<libtorrent::dht::dht_storage_interface>>(libtorrent::dht::dht_settings_const&)>
              *)&this->dht_storage_constructor,libtorrent::dht::dht_default_storage_constructor);
  return;
}

Assistant:

session_params::session_params(settings_pack&& sp
		, std::vector<std::shared_ptr<plugin>> exts)
		: settings(std::move(sp))
		, extensions(std::move(exts))
#ifndef TORRENT_DISABLE_DHT
		, dht_storage_constructor(dht::dht_default_storage_constructor)
#endif
	{}